

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DG2Dot.h
# Opt level: O0

void __thiscall
dg::debug::DG2Dot<dg::LLVMNode>::dumpSubgraphEnd
          (DG2Dot<dg::LLVMNode> *this,DependenceGraph<dg::LLVMNode> *sub,bool with_nodes)

{
  bool bVar1;
  _Rb_tree_const_iterator<const_std::map<llvm::Value_*,_dg::LLVMNode_*,_std::less<llvm::Value_*>,_std::allocator<std::pair<llvm::Value_*const,_dg::LLVMNode_*>_>_>_*>
  _Var2;
  element_type *this_00;
  byte in_DL;
  undefined1 uVar3;
  value_type *in_RDI;
  pair<std::_Rb_tree_const_iterator<const_std::map<llvm::Value_*,_dg::LLVMNode_*,_std::less<llvm::Value_*>,_std::allocator<std::pair<llvm::Value_*const,_dg::LLVMNode_*>_>_>_*>,_bool>
  pVar4;
  int unaff_retaddr;
  LLVMNode *in_stack_00000008;
  DG2Dot<dg::LLVMNode> *in_stack_00000010;
  pair<llvm::Value_*const,_dg::LLVMNode_*> *I_1;
  iterator __end0_1;
  iterator __begin0_1;
  element_type *__range5;
  pair<llvm::Value_*const,_dg::LLVMNode_*> *I;
  iterator __end0;
  iterator __begin0;
  DependenceGraph<dg::LLVMNode> *__range4;
  DependenceGraph<dg::LLVMNode> *in_stack_ffffffffffffff38;
  _Rb_tree_iterator<std::pair<llvm::Value_*const,_dg::LLVMNode_*>_> *in_stack_ffffffffffffff40;
  __shared_ptr<std::map<llvm::Value_*,_dg::LLVMNode_*,_std::less<llvm::Value_*>,_std::allocator<std::pair<llvm::Value_*const,_dg::LLVMNode_*>_>_>,_(__gnu_cxx::_Lock_policy)2>
  *this_01;
  set<const_std::map<llvm::Value_*,_dg::LLVMNode_*,_std::less<llvm::Value_*>,_std::allocator<std::pair<llvm::Value_*const,_dg::LLVMNode_*>_>_>_*,_std::less<const_std::map<llvm::Value_*,_dg::LLVMNode_*,_std::less<llvm::Value_*>,_std::allocator<std::pair<llvm::Value_*const,_dg::LLVMNode_*>_>_>_*>,_std::allocator<const_std::map<llvm::Value_*,_dg::LLVMNode_*,_std::less<llvm::Value_*>,_std::allocator<std::pair<llvm::Value_*const,_dg::LLVMNode_*>_>_>_*>_>
  *in_stack_ffffffffffffff60;
  _Self local_98;
  _Self local_90 [3];
  char *in_stack_ffffffffffffff88;
  map<llvm::Value_*,_dg::LLVMNode_*,_std::less<llvm::Value_*>,_std::allocator<std::pair<llvm::Value_*const,_dg::LLVMNode_*>_>_>
  *prefix;
  undefined8 in_stack_ffffffffffffff90;
  undefined1 in_stack_ffffffffffffff98;
  undefined7 in_stack_ffffffffffffff99;
  DG2Dot<dg::LLVMNode> *in_stack_ffffffffffffffa0;
  _Self local_30;
  _Self local_28 [2];
  byte local_11;
  
  local_11 = in_DL & 1;
  if (local_11 != 0) {
    local_28[0]._M_node = (_Base_ptr)DependenceGraph<dg::LLVMNode>::begin(in_stack_ffffffffffffff38)
    ;
    local_30._M_node = (_Base_ptr)DependenceGraph<dg::LLVMNode>::end(in_stack_ffffffffffffff38);
    while (bVar1 = std::operator!=(local_28,&local_30), bVar1) {
      std::_Rb_tree_iterator<std::pair<llvm::Value_*const,_dg::LLVMNode_*>_>::operator*
                ((_Rb_tree_iterator<std::pair<llvm::Value_*const,_dg::LLVMNode_*>_> *)0x1cc5ef);
      dump_node(in_stack_ffffffffffffffa0,
                (LLVMNode *)CONCAT71(in_stack_ffffffffffffff99,in_stack_ffffffffffffff98),
                (int)((ulong)in_stack_ffffffffffffff90 >> 0x20),in_stack_ffffffffffffff88);
      dump_node_edges(in_stack_00000010,in_stack_00000008,unaff_retaddr);
      std::_Rb_tree_iterator<std::pair<llvm::Value_*const,_dg::LLVMNode_*>_>::operator++
                (in_stack_ffffffffffffff40);
    }
    this_01 = (__shared_ptr<std::map<llvm::Value_*,_dg::LLVMNode_*,_std::less<llvm::Value_*>,_std::allocator<std::pair<llvm::Value_*const,_dg::LLVMNode_*>_>_>,_(__gnu_cxx::_Lock_policy)2>
               *)&stack0xffffffffffffffa0;
    DependenceGraph<dg::LLVMNode>::getGlobalNodes(in_stack_ffffffffffffff38);
    std::
    __shared_ptr<std::map<llvm::Value_*,_dg::LLVMNode_*,_std::less<llvm::Value_*>,_std::allocator<std::pair<llvm::Value_*const,_dg::LLVMNode_*>_>_>,_(__gnu_cxx::_Lock_policy)2>
    ::get(this_01);
    pVar4 = std::
            set<const_std::map<llvm::Value_*,_dg::LLVMNode_*,_std::less<llvm::Value_*>,_std::allocator<std::pair<llvm::Value_*const,_dg::LLVMNode_*>_>_>_*,_std::less<const_std::map<llvm::Value_*,_dg::LLVMNode_*,_std::less<llvm::Value_*>,_std::allocator<std::pair<llvm::Value_*const,_dg::LLVMNode_*>_>_>_*>,_std::allocator<const_std::map<llvm::Value_*,_dg::LLVMNode_*,_std::less<llvm::Value_*>,_std::allocator<std::pair<llvm::Value_*const,_dg::LLVMNode_*>_>_>_*>_>
            ::insert(in_stack_ffffffffffffff60,in_RDI);
    _Var2 = pVar4.first._M_node;
    uVar3 = pVar4.second;
    std::
    shared_ptr<std::map<llvm::Value_*,_dg::LLVMNode_*,_std::less<llvm::Value_*>,_std::allocator<std::pair<llvm::Value_*const,_dg::LLVMNode_*>_>_>_>
    ::~shared_ptr((shared_ptr<std::map<llvm::Value_*,_dg::LLVMNode_*,_std::less<llvm::Value_*>,_std::allocator<std::pair<llvm::Value_*const,_dg::LLVMNode_*>_>_>_>
                   *)0x1cc6b9);
    if (((undefined1  [16])pVar4 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      DependenceGraph<dg::LLVMNode>::getGlobalNodes(in_stack_ffffffffffffff38);
      this_00 = std::
                __shared_ptr_access<std::map<llvm::Value_*,_dg::LLVMNode_*,_std::less<llvm::Value_*>,_std::allocator<std::pair<llvm::Value_*const,_dg::LLVMNode_*>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator*((__shared_ptr_access<std::map<llvm::Value_*,_dg::LLVMNode_*,_std::less<llvm::Value_*>,_std::allocator<std::pair<llvm::Value_*const,_dg::LLVMNode_*>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)this_01);
      std::
      shared_ptr<std::map<llvm::Value_*,_dg::LLVMNode_*,_std::less<llvm::Value_*>,_std::allocator<std::pair<llvm::Value_*const,_dg::LLVMNode_*>_>_>_>
      ::~shared_ptr((shared_ptr<std::map<llvm::Value_*,_dg::LLVMNode_*,_std::less<llvm::Value_*>,_std::allocator<std::pair<llvm::Value_*const,_dg::LLVMNode_*>_>_>_>
                     *)0x1cc6ef);
      prefix = this_00;
      local_90[0]._M_node =
           (_Base_ptr)
           std::
           map<llvm::Value_*,_dg::LLVMNode_*,_std::less<llvm::Value_*>,_std::allocator<std::pair<llvm::Value_*const,_dg::LLVMNode_*>_>_>
           ::begin(this_00);
      local_98._M_node =
           (_Base_ptr)
           std::
           map<llvm::Value_*,_dg::LLVMNode_*,_std::less<llvm::Value_*>,_std::allocator<std::pair<llvm::Value_*const,_dg::LLVMNode_*>_>_>
           ::end(this_00);
      while (bVar1 = std::operator!=(local_90,&local_98), bVar1) {
        std::_Rb_tree_iterator<std::pair<llvm::Value_*const,_dg::LLVMNode_*>_>::operator*
                  ((_Rb_tree_iterator<std::pair<llvm::Value_*const,_dg::LLVMNode_*>_> *)0x1cc735);
        dump_node(in_stack_ffffffffffffffa0,(LLVMNode *)CONCAT71(in_stack_ffffffffffffff99,uVar3),
                  (int)((ulong)_Var2._M_node >> 0x20),(char *)prefix);
        dump_node_edges(in_stack_00000010,in_stack_00000008,unaff_retaddr);
        std::_Rb_tree_iterator<std::pair<llvm::Value_*const,_dg::LLVMNode_*>_>::operator++
                  ((_Rb_tree_iterator<std::pair<llvm::Value_*const,_dg::LLVMNode_*>_> *)this_01);
      }
    }
  }
  std::operator<<((ostream *)(in_RDI + 0x1a),"\t}\n");
  return;
}

Assistant:

void dumpSubgraphEnd(DependenceGraph<NodeT> *sub, bool with_nodes = true) {
        if (with_nodes) {
            // dump all nodes, to get it without BBlocks
            // (we may not have BBlocks or we just don't want
            // to print them
            for (auto &I : *sub) {
                dump_node(I.second, 2);
                dump_node_edges(I.second, 2);
            }

            if (dumpedGlobals.insert(sub->getGlobalNodes().get()).second) {
                for (auto &I : *sub->getGlobalNodes()) {
                    dump_node(I.second, 2, "GLOB");
                    dump_node_edges(I.second, 2);
                }
            }
        }

        out << "\t}\n";
    }